

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O2

FlowBlock * __thiscall
FloatingEdge::getCurrentEdge(FloatingEdge *this,int4 *outedge,FlowBlock *graph)

{
  FlowBlock *pFVar1;
  int4 iVar2;
  FlowBlock *pFVar3;
  FlowBlock *pFVar4;
  
  pFVar3 = this->top;
  while (pFVar4 = pFVar3->parent, pFVar4 != graph) {
    this->top = pFVar4;
    pFVar3 = pFVar4;
  }
  pFVar4 = this->bottom;
  while (pFVar1 = pFVar4->parent, pFVar1 != graph) {
    this->bottom = pFVar1;
    pFVar4 = pFVar1;
  }
  iVar2 = FlowBlock::getOutIndex(pFVar3,pFVar4);
  *outedge = iVar2;
  if (iVar2 < 0) {
    pFVar3 = (FlowBlock *)0x0;
  }
  else {
    pFVar3 = this->top;
  }
  return pFVar3;
}

Assistant:

FlowBlock *FloatingEdge::getCurrentEdge(int4 &outedge,FlowBlock *graph)

{
  while(top->getParent() != graph)
    top = top->getParent();	// Move up through collapse hierarchy to current graph
  while(bottom->getParent() != graph)
    bottom = bottom->getParent();
  outedge = top->getOutIndex(bottom);
  if (outedge < 0)
    return (FlowBlock *)0;	// Edge does not exist (any longer)
  return top;
}